

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgramOptions.cpp
# Opt level: O0

vector<Config::Size,_std::allocator<Config::Size>_> *
ProgramOptions::parseTextureSize
          (vector<Config::Size,_std::allocator<Config::Size>_> *__return_storage_ptr__,string *s)

{
  string *s_00;
  bool bVar1;
  int iVar2;
  reference s_01;
  size_type sVar3;
  reference pvVar4;
  unsigned_long uVar5;
  exception *peVar6;
  exception *anon_var_0;
  uint local_d0;
  Size size;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  iterator __end1;
  iterator __begin1;
  allocator local_61;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *local_18;
  string *s_local;
  vector<Config::Size,_std::allocator<Config::Size>_> *result;
  
  __range1._7_1_ = 0;
  local_18 = s;
  s_local = (string *)__return_storage_ptr__;
  std::vector<Config::Size,_std::allocator<Config::Size>_>::vector(__return_storage_ptr__);
  s_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,",",&local_61);
  string_split(&local_40,s_00,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_28 = &local_40;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(local_28);
  p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&p);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_40);
      bVar1 = std::vector<Config::Size,_std::allocator<Config::Size>_>::empty
                        (__return_storage_ptr__);
      if (bVar1) {
        peVar6 = (exception *)__cxa_allocate_exception(8);
        std::exception::exception(peVar6);
        __cxa_throw(peVar6,&std::exception::typeinfo,std::exception::~exception);
      }
      return __return_storage_ptr__;
    }
    s_01 = __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
    ss.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = s_01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&size.h,"x",(allocator *)((long)&size.w + 3));
    string_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8,s_01,(string *)&size.h,false);
    std::__cxx11::string::~string((string *)&size.h);
    std::allocator<char>::~allocator((allocator<char> *)((long)&size.w + 3));
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8);
    if (sVar3 != 2) {
      peVar6 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(peVar6);
      __cxa_throw(peVar6,&std::exception::typeinfo,std::exception::~exception);
    }
    if ((parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_),
       iVar2 != 0)) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,"^[1-9]\\d{0,9}$",0x10
                );
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_);
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_a8,0);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (pvVar4,&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,0);
    if (!bVar1) {
      peVar6 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(peVar6);
      __cxa_throw(peVar6,&std::exception::typeinfo,std::exception::~exception);
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_a8,1);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (pvVar4,&parseTextureSize(std::__cxx11::string_const&)::e_abi_cxx11_,0);
    if (!bVar1) {
      peVar6 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(peVar6);
      __cxa_throw(peVar6,&std::exception::typeinfo,std::exception::~exception);
    }
    Config::Size::Size((Size *)((long)&anon_var_0 + 4));
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_a8,0);
    uVar5 = std::__cxx11::stoul(pvVar4,(size_t *)0x0,10);
    anon_var_0._4_4_ = (uint)uVar5;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_a8,1);
    uVar5 = std::__cxx11::stoul(pvVar4,(size_t *)0x0,10);
    local_d0 = (uint)uVar5;
    if ((0x10000 < anon_var_0._4_4_) || (0x10000 < local_d0)) break;
    std::vector<Config::Size,std::allocator<Config::Size>>::emplace_back<Config::Size&>
              ((vector<Config::Size,std::allocator<Config::Size>> *)__return_storage_ptr__,
               (Size *)((long)&anon_var_0 + 4));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  peVar6 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(peVar6);
  __cxa_throw(peVar6,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

std::vector<Config::Size> ProgramOptions::parseTextureSize(const std::string& s)
{
    std::vector<Config::Size> result;

    try
    {
        for (const auto& p: string_split(s, ",", false))
        {
            auto ss = string_split(p, "x", false);
            if (ss.size() != 2)
                throw std::exception();

            static const std::regex e(R"(^[1-9]\d{0,9}$)");     // only integers > 0, no more than 10 digits (enough for 4294967295 - max uint32_t)
            if (!std::regex_match(ss[0], e))
                throw std::exception();
            if (!std::regex_match(ss[1], e))
                throw std::exception();

            Config::Size size;
            size.w = std::stoul(ss[0]);
            size.h = std::stoul(ss[1]);
            if (size.w  > 65536 || size.h > 65536)
                throw std::exception();
            result.emplace_back(size);
        }

        if (result.empty())
            throw std::exception();
    }
    catch (const std::exception&)
    {
        throw std::runtime_error("invalid texture size argument");
    }

    return result;
}